

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O3

uint32_t asmjit::x86::InstInternal::stringToInstId(uint32_t arch,char *s,size_t len)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  ulong uVar8;
  size_t sVar9;
  
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if ((0xffffffffffffffee < len - 0x12) && (uVar5 = (int)*s - 0x61, uVar5 < 0x1a)) {
      uVar3 = *(ushort *)(InstDB::instNameIndex + (ulong)uVar5 * 4);
      if (((ulong)uVar3 != 0) &&
         (uVar6 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar5 * 4 + 2) - (ulong)uVar3,
         uVar6 != 0)) {
        puVar7 = (uint *)(InstDB::_instInfoTable + (ulong)uVar3 * 8);
        do {
          uVar8 = uVar6 >> 1;
          puVar1 = puVar7 + uVar8 * 2;
          sVar9 = 0;
          do {
            bVar2 = (&InstDB::_nameData)[sVar9 + (*puVar1 & 0x3fff)];
            if (bVar2 != s[sVar9]) {
              if (bVar2 < (byte)s[sVar9]) {
                puVar7 = puVar1 + 2;
                uVar6 = uVar6 - 1;
                uVar8 = uVar6 >> 1;
              }
              goto LAB_00110505;
            }
            sVar9 = sVar9 + 1;
          } while (len != sVar9);
          if ((&InstDB::_nameData)[len + (*puVar1 & 0x3fff)] == '\0') {
            return (uint32_t)((ulong)(puVar1 + -0x4f0e8) >> 3);
          }
LAB_00110505:
          bVar4 = 1 < uVar6;
          uVar6 = uVar8;
        } while (bVar4);
      }
    }
  }
  return 0;
}

Assistant:

uint32_t InstInternal::stringToInstId(uint32_t arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = InstDB::instNameIndex[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = InstDB::_nameData;
  const InstDB::InstInfo* table = InstDB::_instInfoTable;

  const InstDB::InstInfo* base = table + index;
  const InstDB::InstInfo* end  = table + InstDB::instNameIndex[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const InstDB::InstInfo* cur = base + (lim >> 1);
    int result = Support::cmpInstName(nameData + cur[0]._nameDataIndex, s, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return uint32_t((size_t)(cur - table));
  }

  return Inst::kIdNone;
}